

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App.hpp
# Opt level: O1

Option * __thiscall CLI::App::add_flag(App *this,string *name,string *description)

{
  pointer pcVar1;
  Option *pOVar2;
  IncorrectConstruction *__return_storage_ptr__;
  callback_t fun;
  _Any_data local_f8;
  code *local_e8;
  code *local_e0;
  _Any_data local_d0;
  code *local_c0;
  undefined1 *local_b0 [2];
  undefined1 local_a0 [16];
  string local_90;
  string local_70;
  string local_50;
  
  local_f8._M_unused._M_object = (void *)0x0;
  local_f8._8_8_ = 0;
  local_e0 = std::
             _Function_handler<bool_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/include/CLI/App.hpp:370:31)>
             ::_M_invoke;
  local_e8 = std::
             _Function_handler<bool_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/include/CLI/App.hpp:370:31)>
             ::_M_manager;
  pcVar1 = (name->_M_dataplus)._M_p;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar1,pcVar1 + name->_M_string_length);
  std::
  function<bool_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>)>
  ::function((function<bool_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>)>
              *)&local_d0,
             (function<bool_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>)>
              *)&local_f8);
  pcVar1 = (description->_M_dataplus)._M_p;
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,pcVar1,pcVar1 + description->_M_string_length);
  pOVar2 = add_option(this,&local_70,(callback_t *)&local_d0,&local_90,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if (local_c0 != (code *)0x0) {
    (*local_c0)(&local_d0,&local_d0,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((pOVar2->pname_)._M_string_length == 0) {
    local_b0[0] = local_a0;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"");
    ::std::__cxx11::string::_M_assign((string *)&pOVar2->typeval_);
    pOVar2->expected_ = 0;
    (pOVar2->super_OptionBase<CLI::Option>).required_ = false;
    pOVar2->changeable_ = false;
    if (local_b0[0] != local_a0) {
      operator_delete(local_b0[0]);
    }
    if (local_e8 != (code *)0x0) {
      (*local_e8)(&local_f8,&local_f8,__destroy_functor);
    }
    return pOVar2;
  }
  __return_storage_ptr__ = (IncorrectConstruction *)__cxa_allocate_exception(0x38);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  pcVar1 = (name->_M_dataplus)._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar1,pcVar1 + name->_M_string_length);
  IncorrectConstruction::PositionalFlag(__return_storage_ptr__,&local_50);
  __cxa_throw(__return_storage_ptr__,&IncorrectConstruction::typeinfo,Error::~Error);
}

Assistant:

Option *add_flag(std::string name, std::string description = "") {
        CLI::callback_t fun = [](CLI::results_t) { return true; };

        Option *opt = add_option(name, fun, description, false);
        if(opt->get_positional())
            throw IncorrectConstruction::PositionalFlag(name);
        opt->set_custom_option("", 0);
        return opt;
    }